

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_avx2.c
# Opt level: O0

__m256i * predict_unclipped(__m256i *input,__m256i alpha_q12,__m256i alpha_sign,__m256i dc_q0)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_YMM1_H;
  undefined8 in_register_00001258;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  undefined8 in_YMM2_H;
  undefined8 in_register_00001298;
  __m256i scaled_luma_q0;
  __m256i ac_sign;
  __m256i ac_q3;
  
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = in_XMM1_Qa;
  auVar1._16_8_ = in_YMM1_H;
  auVar1._24_8_ = in_register_00001258;
  auVar2 = vpsignw_avx2(auVar1,(undefined1  [32])*in_RDI);
  auVar1 = vpabsw_avx2((undefined1  [32])*in_RDI);
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = in_XMM0_Qa;
  auVar3._16_8_ = in_YMM0_H;
  auVar3._24_8_ = in_register_00001218;
  auVar1 = vpmulhrsw_avx2(auVar1,auVar3);
  auVar1 = vpsignw_avx2(auVar1,auVar2);
  auVar2._8_8_ = in_XMM2_Qb;
  auVar2._0_8_ = in_XMM2_Qa;
  auVar2._16_8_ = in_YMM2_H;
  auVar2._24_8_ = in_register_00001298;
  vpaddw_avx2(auVar1,auVar2);
  return in_RDI;
}

Assistant:

static inline __m256i predict_unclipped(const __m256i *input, __m256i alpha_q12,
                                        __m256i alpha_sign, __m256i dc_q0) {
  __m256i ac_q3 = _mm256_loadu_si256(input);
  __m256i ac_sign = _mm256_sign_epi16(alpha_sign, ac_q3);
  __m256i scaled_luma_q0 =
      _mm256_mulhrs_epi16(_mm256_abs_epi16(ac_q3), alpha_q12);
  scaled_luma_q0 = _mm256_sign_epi16(scaled_luma_q0, ac_sign);
  return _mm256_add_epi16(scaled_luma_q0, dc_q0);
}